

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O1

void __thiscall QPushButtonPrivate::resetLayoutItemMargins(QPushButtonPrivate *this)

{
  long *plVar1;
  long in_FS_OFFSET;
  QStyleOptionButton opt;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  QArrayData *pQStack_50;
  char16_t *local_48;
  undefined1 *puStack_40;
  QIcon local_38;
  QSize QStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  local_38.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QStack_30 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)local_98);
  (**(code **)(*plVar1 + 0x1b8))(plVar1,local_98);
  QWidgetPrivate::setLayoutItemMargins
            ((QWidgetPrivate *)this,SE_PushButtonLayoutItem,(QStyleOption *)local_98);
  QIcon::~QIcon(&local_38);
  if (pQStack_50 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_50,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPushButtonPrivate::resetLayoutItemMargins()
{
    Q_Q(QPushButton);
    QStyleOptionButton opt;
    q->initStyleOption(&opt);
    setLayoutItemMargins(QStyle::SE_PushButtonLayoutItem, &opt);
}